

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O1

int archive_read_support_filter_xz(archive *_a)

{
  int iVar1;
  archive_read_filter_bidder *in_RAX;
  int iVar2;
  archive_read_filter_bidder *bidder;
  archive_read_filter_bidder *local_18;
  
  local_18 = in_RAX;
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_filter_xz");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    iVar1 = __archive_read_get_bidder((archive_read *)_a,&local_18);
    if (iVar1 == 0) {
      local_18->data = (void *)0x0;
      local_18->name = "xz";
      local_18->bid = xz_bidder_bid;
      local_18->init = xz_bidder_init;
      local_18->options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
      local_18->free = (_func_int_archive_read_filter_bidder_ptr *)0x0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_filter_xz(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *bidder;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_xz");

	if (__archive_read_get_bidder(a, &bidder) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	bidder->data = NULL;
	bidder->name = "xz";
	bidder->bid = xz_bidder_bid;
	bidder->init = xz_bidder_init;
	bidder->options = NULL;
	bidder->free = NULL;
#if HAVE_LZMA_H && HAVE_LIBLZMA
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external xz program for xz decompression");
	return (ARCHIVE_WARN);
#endif
}